

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_reader.c
# Opt level: O0

uint16_t aom_read_primitive_refsubexpfin_(aom_reader *r,uint16_t n,uint16_t k,uint16_t ref)

{
  uint16_t uVar1;
  uint16_t in_CX;
  uint16_t in_DX;
  uint16_t in_SI;
  aom_reader *in_RDI;
  
  uVar1 = in_CX;
  read_primitive_subexpfin_(in_RDI,in_SI,in_DX);
  uVar1 = inv_recenter_finite_nonneg(in_DX,uVar1,in_CX);
  return uVar1;
}

Assistant:

uint16_t aom_read_primitive_refsubexpfin_(aom_reader *r, uint16_t n, uint16_t k,
                                          uint16_t ref ACCT_STR_PARAM) {
  return inv_recenter_finite_nonneg(
      n, ref, read_primitive_subexpfin(r, n, k, ACCT_STR_NAME));
}